

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O3

void cdef_prepare_fb(AV1_COMMON *cm,CdefBlockInfo *fb_info,uint16_t **colbuf,int cdef_left,int fbc,
                    int fbr,int plane)

{
  undefined8 *puVar1;
  uint16_t *puVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  _func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **pp_Var31;
  byte bVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint16_t *puVar36;
  uint16_t *puVar37;
  int iVar38;
  uint16_t *puVar39;
  ulong uVar40;
  uint16_t *puVar41;
  uint uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  undefined1 auVar51 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  long lVar61;
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar90;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  
  iVar47 = (cm->mi_params).mi_rows;
  iVar84 = (cm->mi_params).mi_cols;
  iVar34 = iVar47 + 0x1e;
  if (-1 < iVar47 + 0xf) {
    iVar34 = iVar47 + 0xf;
  }
  iVar38 = iVar84 + 0x1e;
  if (-1 < iVar84 + 0xf) {
    iVar38 = iVar84 + 0xf;
  }
  iVar48 = iVar84 + fbc * -0x10;
  if (0xf < iVar48) {
    iVar48 = 0x10;
  }
  iVar47 = iVar47 + fbr * -0x10;
  if (0xf < iVar47) {
    iVar47 = 0x10;
  }
  bVar3 = (byte)fb_info->mi_wide_l2 & 0x1f;
  uVar49 = iVar48 << bVar3;
  iVar47 = iVar47 << ((byte)fb_info->mi_high_l2 & 0x1f);
  lVar44 = (long)plane;
  iVar35 = (uint)(cdef_left != 0) * 8 + -8;
  puVar2 = fb_info->src;
  if (lVar44 == 0) {
    bVar32 = 0;
  }
  else {
    bVar32 = (byte)cm->seq_params->subsampling_x;
  }
  iVar50 = (int)(iVar84 * 4 + 0xfU & 0xfffffff0) >> (bVar32 & 0x1f);
  iVar84 = (iVar47 + 2) * 0x90;
  iVar38 = (iVar38 >> 4) + -1;
  uVar42 = uVar49 + 8;
  if (iVar38 == fbc) {
    uVar42 = uVar49;
  }
  iVar33 = (iVar34 >> 4) + -1;
  iVar34 = iVar47 + 2;
  if (iVar33 == fbr) {
    iVar34 = iVar47;
  }
  lVar45 = (long)fb_info->coffset + (long)iVar35;
  iVar59 = fb_info->dst_stride;
  if (cm->seq_params->use_highbitdepth == '\0') {
    puVar36 = (uint16_t *)(fb_info->dst + (long)fb_info->roffset * (long)iVar59 + (long)(int)lVar45)
    ;
    pp_Var31 = (_func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **)
               &cdef_copy_rect8_8bit_to_16bit;
  }
  else {
    puVar36 = (uint16_t *)
              ((long)fb_info->roffset * (long)iVar59 * 2 + (long)fb_info->dst * 2 + lVar45 * 2);
    pp_Var31 = &cdef_copy_rect8_16bit_to_16bit;
  }
  puVar41 = fb_info->top_linebuf[lVar44];
  puVar37 = fb_info->bot_linebuf[lVar44];
  (**pp_Var31)(puVar2 + (long)iVar35 + 0x128,0x90,puVar36,iVar59,uVar42 - iVar35,iVar47);
  auVar30 = _DAT_004c9d90;
  auVar29 = _DAT_004c81d0;
  auVar28 = _DAT_004c81c0;
  auVar27 = _DAT_004c81b0;
  auVar55._8_8_ = extraout_XMM1_Qb;
  auVar55._0_8_ = extraout_XMM1_Qa;
  uVar40 = (ulong)uVar49;
  if (fbr < iVar33) {
    puVar36 = puVar37 + fb_info->coffset;
    puVar39 = puVar2 + (long)iVar84 + 8;
    lVar45 = 0;
    do {
      if (0 < iVar48 << bVar3) {
        uVar46 = 0;
        do {
          puVar39[uVar46] = puVar36[uVar46];
          uVar46 = uVar46 + 1;
        } while (uVar40 != uVar46);
      }
      lVar45 = lVar45 + 1;
      puVar39 = puVar39 + 0x90;
      puVar36 = puVar36 + iVar50;
    } while (lVar45 != 2);
  }
  else {
    lVar45 = uVar40 - 1;
    auVar74._8_4_ = (int)lVar45;
    auVar74._0_8_ = lVar45;
    auVar74._12_4_ = (int)((ulong)lVar45 >> 0x20);
    puVar36 = puVar2 + (long)iVar84 + 0xf;
    lVar45 = 0;
    auVar74 = auVar74 ^ _DAT_004c81d0;
    do {
      if (0 < iVar48 << bVar3) {
        lVar43 = 0;
        auVar93 = auVar28;
        auVar78 = auVar27;
        auVar63 = auVar30;
        auVar65 = _DAT_004c9d80;
        do {
          auVar67 = auVar93 ^ auVar29;
          iVar35 = auVar74._0_4_;
          iVar82 = -(uint)(iVar35 < auVar67._0_4_);
          iVar59 = auVar74._4_4_;
          auVar68._4_4_ = -(uint)(iVar59 < auVar67._4_4_);
          iVar83 = auVar74._8_4_;
          iVar89 = -(uint)(iVar83 < auVar67._8_4_);
          iVar90 = auVar74._12_4_;
          auVar68._12_4_ = -(uint)(iVar90 < auVar67._12_4_);
          auVar91._4_4_ = iVar82;
          auVar91._0_4_ = iVar82;
          auVar91._8_4_ = iVar89;
          auVar91._12_4_ = iVar89;
          auVar91 = pshuflw(in_XMM15,auVar91,0xe8);
          auVar70._4_4_ = -(uint)(auVar67._4_4_ == iVar59);
          auVar70._12_4_ = -(uint)(auVar67._12_4_ == iVar90);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar55 = pshuflw(auVar55,auVar70,0xe8);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar92 = pshuflw(auVar91,auVar68,0xe8);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar92 | auVar55 & auVar91) ^ auVar67;
          auVar55 = packssdw(auVar67,auVar67);
          if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -0xe) = 0x4000;
          }
          auVar20._4_4_ = iVar82;
          auVar20._0_4_ = iVar82;
          auVar20._8_4_ = iVar89;
          auVar20._12_4_ = iVar89;
          auVar68 = auVar70 & auVar20 | auVar68;
          auVar67 = packssdw(auVar68,auVar68);
          auVar92._8_4_ = 0xffffffff;
          auVar92._0_8_ = 0xffffffffffffffff;
          auVar92._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar92,auVar67 ^ auVar92);
          if ((auVar67._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -0xc) = 0x4000;
          }
          auVar67 = auVar78 ^ auVar29;
          iVar82 = -(uint)(iVar35 < auVar67._0_4_);
          auVar85._4_4_ = -(uint)(iVar59 < auVar67._4_4_);
          iVar89 = -(uint)(iVar83 < auVar67._8_4_);
          auVar85._12_4_ = -(uint)(iVar90 < auVar67._12_4_);
          auVar69._4_4_ = iVar82;
          auVar69._0_4_ = iVar82;
          auVar69._8_4_ = iVar89;
          auVar69._12_4_ = iVar89;
          iVar82 = -(uint)(auVar67._4_4_ == iVar59);
          iVar89 = -(uint)(auVar67._12_4_ == iVar90);
          auVar21._4_4_ = iVar82;
          auVar21._0_4_ = iVar82;
          auVar21._8_4_ = iVar89;
          auVar21._12_4_ = iVar89;
          auVar85._0_4_ = auVar85._4_4_;
          auVar85._8_4_ = auVar85._12_4_;
          auVar67 = auVar21 & auVar69 | auVar85;
          auVar67 = packssdw(auVar67,auVar67);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar8,auVar67 ^ auVar8);
          if ((auVar67 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -10) = 0x4000;
          }
          auVar67 = pshufhw(auVar67,auVar69,0x84);
          auVar22._4_4_ = iVar82;
          auVar22._0_4_ = iVar82;
          auVar22._8_4_ = iVar89;
          auVar22._12_4_ = iVar89;
          auVar70 = pshufhw(auVar69,auVar22,0x84);
          auVar91 = pshufhw(auVar67,auVar85,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar91 | auVar70 & auVar67) ^ auVar52;
          auVar67 = packssdw(auVar52,auVar52);
          if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -8) = 0x4000;
          }
          auVar67 = auVar63 ^ auVar29;
          iVar82 = -(uint)(iVar35 < auVar67._0_4_);
          auVar72._4_4_ = -(uint)(iVar59 < auVar67._4_4_);
          iVar89 = -(uint)(iVar83 < auVar67._8_4_);
          auVar72._12_4_ = -(uint)(iVar90 < auVar67._12_4_);
          auVar23._4_4_ = iVar82;
          auVar23._0_4_ = iVar82;
          auVar23._8_4_ = iVar89;
          auVar23._12_4_ = iVar89;
          auVar91 = pshuflw(auVar55,auVar23,0xe8);
          auVar53._0_4_ = -(uint)(auVar67._0_4_ == iVar35);
          auVar53._4_4_ = -(uint)(auVar67._4_4_ == iVar59);
          auVar53._8_4_ = -(uint)(auVar67._8_4_ == iVar83);
          auVar53._12_4_ = -(uint)(auVar67._12_4_ == iVar90);
          auVar71._4_4_ = auVar53._4_4_;
          auVar71._0_4_ = auVar53._4_4_;
          auVar71._8_4_ = auVar53._12_4_;
          auVar71._12_4_ = auVar53._12_4_;
          auVar55 = pshuflw(auVar53,auVar71,0xe8);
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar67 = pshuflw(auVar91,auVar72,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          in_XMM15 = (auVar67 | auVar55 & auVar91) ^ auVar9;
          auVar55 = packssdw(auVar55 & auVar91,in_XMM15);
          if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -6) = 0x4000;
          }
          auVar24._4_4_ = iVar82;
          auVar24._0_4_ = iVar82;
          auVar24._8_4_ = iVar89;
          auVar24._12_4_ = iVar89;
          auVar72 = auVar71 & auVar24 | auVar72;
          auVar67 = packssdw(auVar72,auVar72);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55,auVar67 ^ auVar10);
          if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -4) = 0x4000;
          }
          auVar55 = auVar65 ^ auVar29;
          iVar35 = -(uint)(iVar35 < auVar55._0_4_);
          auVar86._4_4_ = -(uint)(iVar59 < auVar55._4_4_);
          iVar83 = -(uint)(iVar83 < auVar55._8_4_);
          auVar86._12_4_ = -(uint)(iVar90 < auVar55._12_4_);
          auVar73._4_4_ = iVar35;
          auVar73._0_4_ = iVar35;
          auVar73._8_4_ = iVar83;
          auVar73._12_4_ = iVar83;
          iVar35 = -(uint)(auVar55._4_4_ == iVar59);
          iVar59 = -(uint)(auVar55._12_4_ == iVar90);
          auVar25._4_4_ = iVar35;
          auVar25._0_4_ = iVar35;
          auVar25._8_4_ = iVar59;
          auVar25._12_4_ = iVar59;
          auVar86._0_4_ = auVar86._4_4_;
          auVar86._8_4_ = auVar86._12_4_;
          auVar55 = auVar25 & auVar73 | auVar86;
          auVar55 = packssdw(auVar55,auVar55);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar11,auVar55 ^ auVar11);
          if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -2) = 0x4000;
          }
          auVar55 = pshufhw(auVar55,auVar73,0x84);
          auVar26._4_4_ = iVar35;
          auVar26._0_4_ = iVar35;
          auVar26._8_4_ = iVar59;
          auVar26._12_4_ = iVar59;
          auVar91 = pshufhw(auVar73,auVar26,0x84);
          auVar67 = pshufhw(auVar55,auVar86,0x84);
          auVar54._8_4_ = 0xffffffff;
          auVar54._0_8_ = 0xffffffffffffffff;
          auVar54._12_4_ = 0xffffffff;
          auVar54 = (auVar67 | auVar91 & auVar55) ^ auVar54;
          auVar55 = packssdw(auVar54,auVar54);
          if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43) = 0x4000;
          }
          lVar61 = auVar93._8_8_;
          auVar93._0_8_ = auVar93._0_8_ + 8;
          auVar93._8_8_ = lVar61 + 8;
          lVar61 = auVar78._8_8_;
          auVar78._0_8_ = auVar78._0_8_ + 8;
          auVar78._8_8_ = lVar61 + 8;
          lVar61 = auVar63._8_8_;
          auVar63._0_8_ = auVar63._0_8_ + 8;
          auVar63._8_8_ = lVar61 + 8;
          lVar61 = auVar65._8_8_;
          auVar65._0_8_ = auVar65._0_8_ + 8;
          auVar65._8_8_ = lVar61 + 8;
          lVar43 = lVar43 + 0x10;
        } while ((ulong)(uVar49 + 7 >> 3) << 4 != lVar43);
      }
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
    } while (lVar45 != 2);
  }
  puVar36 = puVar2 + iVar84;
  if ((fbc < 1) || (iVar33 <= fbr)) {
    puVar36[0] = 0x4000;
    puVar36[1] = 0x4000;
    puVar36[2] = 0x4000;
    puVar36[3] = 0x4000;
    puVar36[4] = 0x4000;
    puVar36[5] = 0x4000;
    puVar36[6] = 0x4000;
    puVar36[7] = 0x4000;
    puVar36[0x90] = 0x4000;
    puVar36[0x91] = 0x4000;
    puVar36[0x92] = 0x4000;
    puVar36[0x93] = 0x4000;
    puVar36[0x94] = 0x4000;
    puVar36[0x95] = 0x4000;
    puVar36[0x96] = 0x4000;
    puVar36[0x97] = 0x4000;
  }
  else {
    puVar39 = puVar37 + (long)fb_info->coffset + -8;
    lVar45 = 0;
    do {
      lVar43 = 0;
      do {
        puVar36[lVar43] = puVar39[lVar43];
        lVar43 = lVar43 + 1;
      } while (lVar43 != 8);
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
      puVar39 = puVar39 + iVar50;
    } while (lVar45 != 2);
  }
  lVar45 = (long)(int)(iVar84 + uVar49);
  if ((fbc < iVar38) && (fbr < iVar33)) {
    puVar36 = puVar2 + lVar45 + 8;
    puVar37 = puVar37 + (long)(int)uVar49 + (long)fb_info->coffset;
    lVar45 = 0;
    do {
      lVar43 = 0;
      do {
        puVar36[lVar43] = puVar37[lVar43];
        lVar43 = lVar43 + 1;
      } while (lVar43 != 8);
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
      puVar37 = puVar37 + iVar50;
    } while (lVar45 != 2);
  }
  else {
    puVar36 = puVar2 + lVar45 + 8;
    puVar36[0] = 0x4000;
    puVar36[1] = 0x4000;
    puVar36[2] = 0x4000;
    puVar36[3] = 0x4000;
    puVar36 = puVar2 + lVar45 + 0xc;
    puVar36[0] = 0x4000;
    puVar36[1] = 0x4000;
    puVar36[2] = 0x4000;
    puVar36[3] = 0x4000;
    puVar36 = puVar2 + lVar45 + 0x98;
    puVar36[0] = 0x4000;
    puVar36[1] = 0x4000;
    puVar36[2] = 0x4000;
    puVar36[3] = 0x4000;
    puVar36 = puVar2 + lVar45 + 0x9c;
    puVar36[0] = 0x4000;
    puVar36[1] = 0x4000;
    puVar36[2] = 0x4000;
    puVar36[3] = 0x4000;
  }
  auVar30 = _DAT_004c9d90;
  auVar29 = _DAT_004c81d0;
  auVar28 = _DAT_004c81c0;
  auVar27 = _DAT_004c81b0;
  if (fbr < 1) {
    lVar45 = uVar40 - 1;
    auVar51._8_4_ = (int)lVar45;
    auVar51._0_8_ = lVar45;
    auVar51._12_4_ = (int)((ulong)lVar45 >> 0x20);
    puVar36 = puVar2 + 0xf;
    lVar45 = 0;
    auVar51 = auVar51 ^ _DAT_004c81d0;
    do {
      if (0 < iVar48 << bVar3) {
        lVar43 = 0;
        auVar60 = auVar28;
        auVar62 = auVar27;
        auVar64 = auVar30;
        auVar66 = _DAT_004c9d80;
        do {
          auVar74 = auVar60 ^ auVar29;
          iVar84 = auVar51._0_4_;
          iVar83 = -(uint)(iVar84 < auVar74._0_4_);
          iVar35 = auVar51._4_4_;
          auVar76._4_4_ = -(uint)(iVar35 < auVar74._4_4_);
          iVar33 = auVar51._8_4_;
          iVar90 = -(uint)(iVar33 < auVar74._8_4_);
          iVar59 = auVar51._12_4_;
          auVar76._12_4_ = -(uint)(iVar59 < auVar74._12_4_);
          auVar12._4_4_ = iVar83;
          auVar12._0_4_ = iVar83;
          auVar12._8_4_ = iVar90;
          auVar12._12_4_ = iVar90;
          auVar93 = pshuflw(in_XMM15,auVar12,0xe8);
          auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar35);
          auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar59);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar55 = pshuflw(auVar55,auVar75,0xe8);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar74 = pshuflw(auVar93,auVar76,0xe8);
          auVar94._8_4_ = 0xffffffff;
          auVar94._0_8_ = 0xffffffffffffffff;
          auVar94._12_4_ = 0xffffffff;
          auVar94 = (auVar74 | auVar55 & auVar93) ^ auVar94;
          auVar55 = packssdw(auVar94,auVar94);
          if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -0xe) = 0x4000;
          }
          auVar13._4_4_ = iVar83;
          auVar13._0_4_ = iVar83;
          auVar13._8_4_ = iVar90;
          auVar13._12_4_ = iVar90;
          auVar76 = auVar75 & auVar13 | auVar76;
          auVar74 = packssdw(auVar76,auVar76);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar4,auVar74 ^ auVar4);
          if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -0xc) = 0x4000;
          }
          auVar74 = auVar62 ^ auVar29;
          iVar83 = -(uint)(iVar84 < auVar74._0_4_);
          auVar87._4_4_ = -(uint)(iVar35 < auVar74._4_4_);
          iVar90 = -(uint)(iVar33 < auVar74._8_4_);
          auVar87._12_4_ = -(uint)(iVar59 < auVar74._12_4_);
          auVar77._4_4_ = iVar83;
          auVar77._0_4_ = iVar83;
          auVar77._8_4_ = iVar90;
          auVar77._12_4_ = iVar90;
          iVar83 = -(uint)(auVar74._4_4_ == iVar35);
          iVar90 = -(uint)(auVar74._12_4_ == iVar59);
          auVar14._4_4_ = iVar83;
          auVar14._0_4_ = iVar83;
          auVar14._8_4_ = iVar90;
          auVar14._12_4_ = iVar90;
          auVar87._0_4_ = auVar87._4_4_;
          auVar87._8_4_ = auVar87._12_4_;
          auVar74 = auVar14 & auVar77 | auVar87;
          auVar74 = packssdw(auVar74,auVar74);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar74 = packssdw(auVar74 ^ auVar5,auVar74 ^ auVar5);
          if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -10) = 0x4000;
          }
          auVar74 = pshufhw(auVar74,auVar77,0x84);
          auVar15._4_4_ = iVar83;
          auVar15._0_4_ = iVar83;
          auVar15._8_4_ = iVar90;
          auVar15._12_4_ = iVar90;
          auVar78 = pshufhw(auVar77,auVar15,0x84);
          auVar93 = pshufhw(auVar74,auVar87,0x84);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar93 | auVar78 & auVar74) ^ auVar56;
          auVar74 = packssdw(auVar56,auVar56);
          if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -8) = 0x4000;
          }
          auVar74 = auVar64 ^ auVar29;
          iVar83 = -(uint)(iVar84 < auVar74._0_4_);
          auVar80._4_4_ = -(uint)(iVar35 < auVar74._4_4_);
          iVar90 = -(uint)(iVar33 < auVar74._8_4_);
          auVar80._12_4_ = -(uint)(iVar59 < auVar74._12_4_);
          auVar16._4_4_ = iVar83;
          auVar16._0_4_ = iVar83;
          auVar16._8_4_ = iVar90;
          auVar16._12_4_ = iVar90;
          auVar93 = pshuflw(auVar55,auVar16,0xe8);
          auVar57._0_4_ = -(uint)(auVar74._0_4_ == iVar84);
          auVar57._4_4_ = -(uint)(auVar74._4_4_ == iVar35);
          auVar57._8_4_ = -(uint)(auVar74._8_4_ == iVar33);
          auVar57._12_4_ = -(uint)(auVar74._12_4_ == iVar59);
          auVar79._4_4_ = auVar57._4_4_;
          auVar79._0_4_ = auVar57._4_4_;
          auVar79._8_4_ = auVar57._12_4_;
          auVar79._12_4_ = auVar57._12_4_;
          auVar55 = pshuflw(auVar57,auVar79,0xe8);
          auVar80._0_4_ = auVar80._4_4_;
          auVar80._8_4_ = auVar80._12_4_;
          auVar74 = pshuflw(auVar93,auVar80,0xe8);
          in_XMM15._8_4_ = 0xffffffff;
          in_XMM15._0_8_ = 0xffffffffffffffff;
          in_XMM15._12_4_ = 0xffffffff;
          in_XMM15 = (auVar74 | auVar55 & auVar93) ^ in_XMM15;
          auVar55 = packssdw(auVar55 & auVar93,in_XMM15);
          if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -6) = 0x4000;
          }
          auVar17._4_4_ = iVar83;
          auVar17._0_4_ = iVar83;
          auVar17._8_4_ = iVar90;
          auVar17._12_4_ = iVar90;
          auVar80 = auVar79 & auVar17 | auVar80;
          auVar74 = packssdw(auVar80,auVar80);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55,auVar74 ^ auVar6);
          if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -4) = 0x4000;
          }
          auVar55 = auVar66 ^ auVar29;
          iVar84 = -(uint)(iVar84 < auVar55._0_4_);
          auVar88._4_4_ = -(uint)(iVar35 < auVar55._4_4_);
          iVar33 = -(uint)(iVar33 < auVar55._8_4_);
          auVar88._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
          auVar81._4_4_ = iVar84;
          auVar81._0_4_ = iVar84;
          auVar81._8_4_ = iVar33;
          auVar81._12_4_ = iVar33;
          iVar84 = -(uint)(auVar55._4_4_ == iVar35);
          iVar35 = -(uint)(auVar55._12_4_ == iVar59);
          auVar18._4_4_ = iVar84;
          auVar18._0_4_ = iVar84;
          auVar18._8_4_ = iVar35;
          auVar18._12_4_ = iVar35;
          auVar88._0_4_ = auVar88._4_4_;
          auVar88._8_4_ = auVar88._12_4_;
          auVar55 = auVar18 & auVar81 | auVar88;
          auVar55 = packssdw(auVar55,auVar55);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar7,auVar55 ^ auVar7);
          if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43 + -2) = 0x4000;
          }
          auVar55 = pshufhw(auVar55,auVar81,0x84);
          auVar19._4_4_ = iVar84;
          auVar19._0_4_ = iVar84;
          auVar19._8_4_ = iVar35;
          auVar19._12_4_ = iVar35;
          auVar93 = pshufhw(auVar81,auVar19,0x84);
          auVar74 = pshufhw(auVar55,auVar88,0x84);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar74 | auVar93 & auVar55) ^ auVar58;
          auVar55 = packssdw(auVar58,auVar58);
          if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)puVar36 + lVar43) = 0x4000;
          }
          lVar61 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + 8;
          auVar60._8_8_ = lVar61 + 8;
          lVar61 = auVar62._8_8_;
          auVar62._0_8_ = auVar62._0_8_ + 8;
          auVar62._8_8_ = lVar61 + 8;
          lVar61 = auVar64._8_8_;
          auVar64._0_8_ = auVar64._0_8_ + 8;
          auVar64._8_8_ = lVar61 + 8;
          lVar61 = auVar66._8_8_;
          auVar66._0_8_ = auVar66._0_8_ + 8;
          auVar66._8_8_ = lVar61 + 8;
          lVar43 = lVar43 + 0x10;
        } while ((ulong)(uVar49 + 7 >> 3) << 4 != lVar43);
      }
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
    } while (lVar45 != 2);
  }
  else {
    puVar36 = puVar2 + 8;
    puVar37 = puVar41 + fb_info->coffset;
    lVar45 = 0;
    do {
      if (0 < iVar48 << bVar3) {
        uVar46 = 0;
        do {
          puVar36[uVar46] = puVar37[uVar46];
          uVar46 = uVar46 + 1;
        } while (uVar40 != uVar46);
      }
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
      puVar37 = puVar37 + iVar50;
    } while (lVar45 != 2);
  }
  if (fbc < 1 || fbr < 1) {
    puVar2[0] = 0x4000;
    puVar2[1] = 0x4000;
    puVar2[2] = 0x4000;
    puVar2[3] = 0x4000;
    puVar2[4] = 0x4000;
    puVar2[5] = 0x4000;
    puVar2[6] = 0x4000;
    puVar2[7] = 0x4000;
    puVar2[0x90] = 0x4000;
    puVar2[0x91] = 0x4000;
    puVar2[0x92] = 0x4000;
    puVar2[0x93] = 0x4000;
    puVar2[0x94] = 0x4000;
    puVar2[0x95] = 0x4000;
    puVar2[0x96] = 0x4000;
    puVar2[0x97] = 0x4000;
  }
  else {
    puVar37 = puVar41 + (long)fb_info->coffset + -8;
    lVar45 = 0;
    puVar36 = puVar2;
    do {
      lVar43 = 0;
      do {
        puVar36[lVar43] = puVar37[lVar43];
        lVar43 = lVar43 + 1;
      } while (lVar43 != 8);
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
      puVar37 = puVar37 + iVar50;
    } while (lVar45 != 2);
  }
  puVar36 = puVar2 + (int)uVar49;
  if ((fbr < 1) || (iVar38 <= fbc)) {
    puVar36[8] = 0x4000;
    puVar36[9] = 0x4000;
    puVar36[10] = 0x4000;
    puVar36[0xb] = 0x4000;
    puVar36[0xc] = 0x4000;
    puVar36[0xd] = 0x4000;
    puVar36[0xe] = 0x4000;
    puVar36[0xf] = 0x4000;
    puVar36[0x98] = 0x4000;
    puVar36[0x99] = 0x4000;
    puVar36[0x9a] = 0x4000;
    puVar36[0x9b] = 0x4000;
    puVar36[0x9c] = 0x4000;
    puVar36[0x9d] = 0x4000;
    puVar36[0x9e] = 0x4000;
    puVar36[0x9f] = 0x4000;
  }
  else {
    puVar36 = puVar2 + (long)(int)uVar49 + 8;
    puVar41 = puVar41 + (long)(int)uVar49 + (long)fb_info->coffset;
    lVar45 = 0;
    do {
      lVar43 = 0;
      do {
        puVar36[lVar43] = puVar41[lVar43];
        lVar43 = lVar43 + 1;
      } while (lVar43 != 8);
      lVar45 = lVar45 + 1;
      puVar36 = puVar36 + 0x90;
      puVar41 = puVar41 + iVar50;
    } while (lVar45 != 2);
  }
  puVar36 = colbuf[lVar44];
  if (cdef_left != 0) {
    if (iVar34 < -1) goto LAB_0038bb96;
    uVar40 = 0;
    puVar41 = puVar36;
    puVar37 = puVar2;
    do {
      lVar44 = 0;
      do {
        puVar37[lVar44] = puVar41[lVar44];
        lVar44 = lVar44 + 1;
      } while (lVar44 != 8);
      uVar40 = uVar40 + 1;
      puVar37 = puVar37 + 0x90;
      puVar41 = puVar41 + 8;
    } while (uVar40 != iVar34 + 2);
  }
  puVar41 = puVar2 + (int)uVar49;
  if (-2 < iVar34) {
    uVar40 = 0;
    do {
      lVar44 = 0;
      do {
        puVar36[lVar44] = puVar41[lVar44];
        lVar44 = lVar44 + 1;
      } while (lVar44 != 8);
      uVar40 = uVar40 + 1;
      puVar36 = puVar36 + 8;
      puVar41 = puVar41 + 0x90;
    } while (uVar40 != iVar34 + 2);
  }
LAB_0038bb96:
  if ((fb_info->frame_boundary[1] != 0) && (-4 < iVar47)) {
    lVar44 = 0;
    do {
      *(undefined8 *)((long)puVar2 + lVar44) = 0x4000400040004000;
      ((undefined8 *)((long)puVar2 + lVar44))[1] = 0x4000400040004000;
      lVar44 = lVar44 + 0x120;
    } while ((ulong)(iVar47 + 4) * 0x120 != lVar44);
  }
  if ((fb_info->frame_boundary[3] != 0) && (-4 < iVar47)) {
    lVar44 = 0;
    do {
      puVar1 = (undefined8 *)((long)(puVar2 + (int)uVar49) + lVar44 + 0x10);
      *puVar1 = 0x4000400040004000;
      puVar1[1] = 0x4000400040004000;
      lVar44 = lVar44 + 0x120;
    } while ((ulong)(iVar47 + 4) * 0x120 != lVar44);
  }
  return;
}

Assistant:

static void cdef_prepare_fb(const AV1_COMMON *const cm, CdefBlockInfo *fb_info,
                            uint16_t **const colbuf, const int cdef_left,
                            int fbc, int fbr, int plane) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  uint16_t *src = fb_info->src;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(mi_params->mi_cols << MI_SIZE_LOG2, 4);
  const int nvfb = (mi_params->mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int nhfb = (mi_params->mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  int cstart = 0;
  if (!cdef_left) cstart = -CDEF_HBORDER;
  int rend, cend;
  const int nhb =
      AOMMIN(MI_SIZE_64X64, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
  const int nvb =
      AOMMIN(MI_SIZE_64X64, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
  const int hsize = nhb << fb_info->mi_wide_l2;
  const int vsize = nvb << fb_info->mi_high_l2;
  const uint16_t *top_linebuf = fb_info->top_linebuf[plane];
  const uint16_t *bot_linebuf = fb_info->bot_linebuf[plane];
  const int bot_offset = (vsize + CDEF_VBORDER) * CDEF_BSTRIDE;
  const int stride =
      luma_stride >> (plane == AOM_PLANE_Y ? 0 : cm->seq_params->subsampling_x);

  if (fbc == nhfb - 1)
    cend = hsize;
  else
    cend = hsize + CDEF_HBORDER;

  if (fbr == nvfb - 1)
    rend = vsize;
  else
    rend = vsize + CDEF_VBORDER;

  /* Copy in the pixels we need from the current superblock for
  deringing.*/
  av1_cdef_copy_sb8_16(
      cm, &src[CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER + cstart],
      CDEF_BSTRIDE, fb_info->dst, fb_info->roffset, fb_info->coffset + cstart,
      fb_info->dst_stride, vsize, cend - cstart);

  /* Copy in the pixels we need for the current superblock from bottom buffer.*/
  if (fbr < nvfb - 1) {
    copy_rect(&src[bot_offset + CDEF_HBORDER], CDEF_BSTRIDE,
              &bot_linebuf[fb_info->coffset], stride, CDEF_VBORDER, hsize);
  } else {
    fill_rect(&src[bot_offset + CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER,
              hsize, CDEF_VERY_LARGE);
  }
  if (fbr < nvfb - 1 && fbc > 0) {
    copy_rect(&src[bot_offset], CDEF_BSTRIDE,
              &bot_linebuf[fb_info->coffset - CDEF_HBORDER], stride,
              CDEF_VBORDER, CDEF_HBORDER);
  } else {
    fill_rect(&src[bot_offset], CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (fbr < nvfb - 1 && fbc < nhfb - 1) {
    copy_rect(&src[bot_offset + hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              &bot_linebuf[fb_info->coffset + hsize], stride, CDEF_VBORDER,
              CDEF_HBORDER);
  } else {
    fill_rect(&src[bot_offset + hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }

  /* Copy in the pixels we need from the current superblock from top buffer.*/
  if (fbr > 0) {
    copy_rect(&src[CDEF_HBORDER], CDEF_BSTRIDE, &top_linebuf[fb_info->coffset],
              stride, CDEF_VBORDER, hsize);
  } else {
    fill_rect(&src[CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER, hsize,
              CDEF_VERY_LARGE);
  }
  if (fbr > 0 && fbc > 0) {
    copy_rect(src, CDEF_BSTRIDE, &top_linebuf[fb_info->coffset - CDEF_HBORDER],
              stride, CDEF_VBORDER, CDEF_HBORDER);
  } else {
    fill_rect(src, CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }
  if (fbr > 0 && fbc < nhfb - 1) {
    copy_rect(&src[hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              &top_linebuf[fb_info->coffset + hsize], stride, CDEF_VBORDER,
              CDEF_HBORDER);
  } else {
    fill_rect(&src[hsize + CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER,
              CDEF_HBORDER, CDEF_VERY_LARGE);
  }
  if (cdef_left) {
    /* If we deringed the superblock on the left then we need to copy in
    saved pixels. */
    copy_rect(src, CDEF_BSTRIDE, colbuf[plane], CDEF_HBORDER,
              rend + CDEF_VBORDER, CDEF_HBORDER);
  }
  /* Saving pixels in case we need to dering the superblock on the
  right. */
  copy_rect(colbuf[plane], CDEF_HBORDER, src + hsize, CDEF_BSTRIDE,
            rend + CDEF_VBORDER, CDEF_HBORDER);

  if (fb_info->frame_boundary[LEFT]) {
    fill_rect(src, CDEF_BSTRIDE, vsize + 2 * CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (fb_info->frame_boundary[RIGHT]) {
    fill_rect(&src[hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              vsize + 2 * CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }
}